

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_base.h
# Opt level: O0

void __thiscall bandit::reporter::progress_base::test_run_starting(progress_base *this)

{
  progress_base *this_local;
  
  this->specs_run_ = 0;
  this->specs_succeeded_ = 0;
  this->specs_failed_ = 0;
  this->specs_skipped_ = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->failures_);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->contexts_);
  return;
}

Assistant:

void test_run_starting() override {
        specs_run_ = 0;
        specs_succeeded_ = 0;
        specs_failed_ = 0;
        specs_skipped_ = 0;
        failures_.clear();
        contexts_.clear();
      }